

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_sse2.c
# Opt level: O2

void aom_hadamard_16x16_sse2(int16_t *src_diff,ptrdiff_t src_stride,tran_low_t *coeff)

{
  hadamard_16x16_sse2(src_diff,src_stride,coeff,1);
  return;
}

Assistant:

void aom_hadamard_16x16_sse2(const int16_t *src_diff, ptrdiff_t src_stride,
                             tran_low_t *coeff) {
  hadamard_16x16_sse2(src_diff, src_stride, coeff, 1);
}